

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplicationstatic.h
# Opt level: O0

PlainType * __thiscall
QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader>::pointer
          (ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader> *this)

{
  char cVar1;
  long in_FS_OFFSET;
  Object *unaff_retaddr;
  QCoreApplication *app;
  QMutexLocker<QBasicMutex> locker;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  char newValue;
  QMutexLocker<QBasicMutex> *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffc0;
  PlainType *local_28;
  Connection local_20;
  undefined8 local_18;
  _func_void *slot;
  ContextType *context;
  
  context = *(ContextType **)(in_FS_OFFSET + 0x28);
  cVar1 = QBasicAtomicInteger<signed_char>::loadAcquire
                    ((QBasicAtomicInteger<signed_char> *)0x27b3a3);
  if (cVar1 == -1) {
    local_28 = realPointer();
  }
  else {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    slot = (_func_void *)0xaaaaaaaaaaaaaaaa;
    QMutexLocker<QBasicMutex>::QMutexLocker
              (in_stack_ffffffffffffffb0,
               (QBasicMutex *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    newValue = (char)((uint)in_stack_ffffffffffffffac >> 0x18);
    cVar1 = QBasicAtomicInteger<signed_char>::loadRelaxed
                      ((QBasicAtomicInteger<signed_char> *)0x27b3ef);
    if (cVar1 == '\0') {
      anon_unknown.dwarf_4f207b::Q_QAS_qtlsbLoader::innerFunction(in_stack_ffffffffffffffc0);
      QCoreApplication::instance();
      QObject::connect<void(QObject::*)(QObject*),void(&)()>
                (unaff_retaddr,(offset_in_QObject_to_subr)app,context,slot,
                 (ConnectionType)locker.m_mutex);
      QMetaObject::Connection::~Connection(&local_20);
      QBasicAtomicInteger<signed_char>::storeRelease
                ((QBasicAtomicInteger<signed_char> *)in_stack_ffffffffffffffb0,newValue);
    }
    local_28 = realPointer();
    QMutexLocker<QBasicMutex>::~QMutexLocker(in_stack_ffffffffffffffb0);
  }
  if (*(ContextType **)(in_FS_OFFSET + 0x28) == context) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

PlainType *pointer() noexcept(MutexLockIsNoexcept && ConstructionIsNoexcept)
    {
        if (guard.loadAcquire() == QtGlobalStatic::Initialized)
            return realPointer();
        QMutexLocker locker(&mutex);
        if (guard.loadRelaxed() == QtGlobalStatic::Uninitialized) {
            QAS::innerFunction(&storage);
            const auto *app = QCoreApplication::instance();
            Q_ASSERT_X(app, Q_FUNC_INFO,
                       "The application static was used without a QCoreApplication instance");
            QObject::connect(app, &QObject::destroyed, app, reset, Qt::DirectConnection);
            guard.storeRelease(QtGlobalStatic::Initialized);
        }
        return realPointer();
    }